

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O0

uint64_t lzma_raw_coder_memusage(lzma_filter_find coder_find,lzma_filter *filters)

{
  lzma_ret lVar1;
  long lVar2;
  uint64_t usage;
  lzma_filter_coder *fc;
  size_t tmp;
  size_t i;
  uint64_t total;
  lzma_filter *filters_local;
  lzma_filter_find coder_find_local;
  
  i = 0;
  tmp = 0;
  total = (uint64_t)filters;
  filters_local = (lzma_filter *)coder_find;
  lVar1 = validate_chain(filters,(size_t *)&fc);
  if (lVar1 == LZMA_OK) {
    do {
      lVar2 = (*(code *)filters_local)(*(undefined8 *)(total + tmp * 0x10));
      if (lVar2 == 0) {
        return 0xffffffffffffffff;
      }
      if (*(long *)(lVar2 + 0x10) == 0) {
        i = i + 0x400;
      }
      else {
        lVar2 = (**(code **)(lVar2 + 0x10))(*(undefined8 *)(total + tmp * 0x10 + 8));
        if (lVar2 == -1) {
          return 0xffffffffffffffff;
        }
        i = lVar2 + i;
      }
      tmp = tmp + 1;
    } while (*(long *)(total + tmp * 0x10) != -1);
    coder_find_local = (lzma_filter_find)(i + 0x8000);
  }
  else {
    coder_find_local = (lzma_filter_find)0xffffffffffffffff;
  }
  return (uint64_t)coder_find_local;
}

Assistant:

extern uint64_t
lzma_raw_coder_memusage(lzma_filter_find coder_find,
		const lzma_filter *filters)
{
	uint64_t total = 0;
	size_t i = 0;

	// The chain has to have at least one filter.
	{
		size_t tmp;
		if (validate_chain(filters, &tmp) != LZMA_OK)
			return UINT64_MAX;
	}

	do {
		const lzma_filter_coder *const fc
				 = coder_find(filters[i].id);
		if (fc == NULL)
			return UINT64_MAX; // Unsupported Filter ID

		if (fc->memusage == NULL) {
			// This filter doesn't have a function to calculate
			// the memory usage and validate the options. Such
			// filters need only little memory, so we use 1 KiB
			// as a good estimate. They also accept all possible
			// options, so there's no need to worry about lack
			// of validation.
			total += 1024;
		} else {
			// Call the filter-specific memory usage calculation
			// function.
			const uint64_t usage
					= fc->memusage(filters[i].options);
			if (usage == UINT64_MAX)
				return UINT64_MAX; // Invalid options

			total += usage;
		}
	} while (filters[++i].id != LZMA_VLI_UNKNOWN);

	// Add some fixed amount of extra. It's to compensate memory usage
	// of Stream, Block etc. coders, malloc() overhead, stack etc.
	return total + LZMA_MEMUSAGE_BASE;
}